

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::EmbeddingNDLayerParams::MergeFrom
          (EmbeddingNDLayerParams *this,EmbeddingNDLayerParams *from)

{
  bool bVar1;
  LogMessage *other;
  WeightParams *pWVar2;
  WeightParams *pWVar3;
  uint64_t uVar4;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  EmbeddingNDLayerParams *local_18;
  EmbeddingNDLayerParams *from_local;
  EmbeddingNDLayerParams *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x63eb);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  bVar1 = _internal_has_weights(local_18);
  if (bVar1) {
    pWVar2 = _internal_mutable_weights(this);
    pWVar3 = _internal_weights(local_18);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = _internal_has_bias(local_18);
  if (bVar1) {
    pWVar2 = _internal_mutable_bias(this);
    pWVar3 = _internal_bias(local_18);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  uVar4 = _internal_vocabsize(local_18);
  if (uVar4 != 0) {
    uVar4 = _internal_vocabsize(local_18);
    _internal_set_vocabsize(this,uVar4);
  }
  uVar4 = _internal_embeddingsize(local_18);
  if (uVar4 != 0) {
    uVar4 = _internal_embeddingsize(local_18);
    _internal_set_embeddingsize(this,uVar4);
  }
  bVar1 = _internal_hasbias(local_18);
  if (bVar1) {
    bVar1 = _internal_hasbias(local_18);
    _internal_set_hasbias(this,bVar1);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void EmbeddingNDLayerParams::MergeFrom(const EmbeddingNDLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.EmbeddingNDLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_has_weights()) {
    _internal_mutable_weights()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_weights());
  }
  if (from._internal_has_bias()) {
    _internal_mutable_bias()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_bias());
  }
  if (from._internal_vocabsize() != 0) {
    _internal_set_vocabsize(from._internal_vocabsize());
  }
  if (from._internal_embeddingsize() != 0) {
    _internal_set_embeddingsize(from._internal_embeddingsize());
  }
  if (from._internal_hasbias() != 0) {
    _internal_set_hasbias(from._internal_hasbias());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}